

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall
Alice::ObliviousTranslate
          (Alice *this,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_P,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_D)

{
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *__x;
  int iVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long *plVar5;
  int j;
  long lVar6;
  long lVar7;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_a8;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_90;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_78;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_60;
  long local_48;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *local_40;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *local_38;
  
  local_40 = Perm_P;
  local_38 = Perm_D;
  if (ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
      ::fout == '\0') {
    iVar1 = __cxa_guard_acquire(&ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                                 ::fout);
    if (iVar1 != 0) {
      std::ofstream::ofstream
                (ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                 ::fout,"../debug/alice/DebugTranslate_A.txt",_S_out);
      __cxa_atexit(std::ofstream::~ofstream,
                   ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                   ::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                           ::fout);
    }
  }
  if (0 < (this->super_Party).n_p) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar2 = **(long **)((long)&(((this->super_Party).P.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar6);
      std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                (&local_a8,local_38);
      lVar2 = ObliviousTranslateSingleAddress(this,lVar2,&local_a8);
      plVar5 = *(long **)((long)&(((this->super_Party).P.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar6);
      *plVar5 = lVar2;
      if (local_a8.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        plVar5 = *(long **)((long)&(((this->super_Party).P.
                                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                   super__Vector_impl_data + lVar6);
      }
      lVar2 = plVar5[1];
      std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                (&local_90,local_38);
      lVar3 = ObliviousTranslateSingleAddress(this,lVar2,&local_90);
      __x = local_40;
      lVar2 = *(long *)((long)&(((this->super_Party).P.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data + lVar6);
      *(long *)(lVar2 + 8) = lVar3;
      local_48 = lVar7;
      if (local_90.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        lVar2 = *(long *)((long)&(((this->super_Party).P.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar6);
      }
      lVar7 = *(long *)(lVar2 + 0x10);
      std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                (&local_78,__x);
      lVar2 = ObliviousTranslateSingleAddress(this,lVar7,&local_78);
      lVar7 = *(long *)((long)&(((this->super_Party).P.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data + lVar6);
      *(long *)(lVar7 + 0x10) = lVar2;
      if (local_78.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        lVar7 = *(long *)((long)&(((this->super_Party).P.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar6);
      }
      lVar7 = *(long *)(lVar7 + 0x18);
      std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                (&local_60,__x);
      lVar2 = ObliviousTranslateSingleAddress(this,lVar7,&local_60);
      lVar7 = local_48;
      *(long *)(*(long *)((long)&(((this->super_Party).P.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar6) + 0x18) = lVar2;
      if (local_60.
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar7 < (this->super_Party).n_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
             ::fout,"Translation # ",0xe);
  iVar1 = ObliviousTranslate::count;
  ObliviousTranslate::count = ObliviousTranslate::count + 1;
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)
                      ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                      ::fout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (0 < (this->super_Party).n_p) {
    local_38 = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0;
    do {
      lVar7 = 0;
      do {
        poVar4 = std::ostream::_M_insert<long>(0x10b460);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                 ::fout,"\n",1);
      local_38 = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                 ((long)local_38 + 1);
    } while ((long)local_38 < (long)(this->super_Party).n_p);
  }
  return;
}

Assistant:

void Alice::ObliviousTranslate(std::vector<std::pair<long,long>> Perm_P, std::vector<std::pair<long,long>>Perm_D)
{
    static int count=0;
    static std::ofstream fout("../debug/alice/DebugTranslate_A.txt");
    for(int i = 0; i < n_p; i++)
    {
        P[i][0] = ObliviousTranslateSingleAddress(P[i][0], Perm_D);
        P[i][1] = ObliviousTranslateSingleAddress(P[i][1], Perm_D);
        P[i][2] = ObliviousTranslateSingleAddress(P[i][2], Perm_P);
        P[i][3] = ObliviousTranslateSingleAddress(P[i][3], Perm_P);
    }
    fout<<"Translation # "<<count++<<"\n";
    for(int i=0; i<n_p; i++)
    {
        for(int j=0; j<5; j++)
            fout<<P[i][j]<<" ";
        fout<<"\n";
    }    

}